

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subset_iterator.hpp
# Opt level: O3

void __thiscall
burst::
subset_iterator<const_char_*,_std::less<void>,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
::subset_iterator(subset_iterator<const_char_*,_std::less<void>,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                  *this,char *first,char *last)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  pointer ppcVar4;
  char *pcVar5;
  __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_> _Var6;
  char *pcVar7;
  allocator_type local_19;
  
  this->m_begin = first;
  this->m_end = last;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (&this->m_subset,(long)last - (long)first,&local_19);
  this->m_subset_size = 0;
  pcVar2 = this->m_begin;
  pcVar3 = this->m_end;
  pcVar5 = pcVar2;
  if (pcVar2 != pcVar3) {
    do {
      pcVar7 = pcVar2 + 1;
      pcVar5 = pcVar3;
      if (pcVar7 == pcVar3) break;
      cVar1 = *pcVar2;
      pcVar5 = pcVar7;
      pcVar2 = pcVar7;
    } while (cVar1 <= *pcVar7);
  }
  if (pcVar5 != pcVar3) {
    __assert_fail("std::is_sorted(m_begin, m_end, m_compare)",
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/subset_iterator.hpp"
                  ,0x5d,
                  "burst::subset_iterator<const char *>::subset_iterator(ForwardIterator, ForwardIterator, compare_type) [ForwardIterator = const char *, Compare = std::less<void>, SubsetContainer = std::vector<const char *>]"
                 );
  }
  ppcVar4 = (this->m_subset).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  _Var6 = next_subset<__gnu_cxx::__normal_iterator<char_const**,std::vector<char_const*,std::allocator<char_const*>>>,char_const*,std::less<void>>
                    (ppcVar4,ppcVar4);
  this->m_subset_size =
       (long)_Var6._M_current -
       (long)(this->m_subset).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3;
  return;
}

Assistant:

explicit subset_iterator
            (
                ForwardIterator first, ForwardIterator last,
                compare_type compare = compare_type{}
            ):
            m_begin(std::move(first)),
            m_end(std::move(last)),
            m_subset(static_cast<std::size_t>(std::distance(m_begin, m_end))),
            m_subset_size(0),
            m_compare(compare)
        {
            BOOST_ASSERT(std::is_sorted(m_begin, m_end, m_compare));
            increment();
        }